

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

ssize_t Curl_bufq_sipn(bufq *q,size_t max_len,Curl_bufq_reader *reader,void *reader_ctx,
                      CURLcode *err)

{
  buf_chunk *chunk;
  ssize_t nread;
  buf_chunk *tail;
  CURLcode *err_local;
  void *reader_ctx_local;
  Curl_bufq_reader *reader_local;
  size_t max_len_local;
  bufq *q_local;
  
  *err = CURLE_AGAIN;
  chunk = get_non_full_tail(q);
  if (chunk == (buf_chunk *)0x0) {
    if (q->chunk_count < q->max_chunks) {
      *err = CURLE_OUT_OF_MEMORY;
      q_local = (bufq *)0xffffffffffffffff;
    }
    else {
      *err = CURLE_AGAIN;
      q_local = (bufq *)0xffffffffffffffff;
    }
  }
  else {
    q_local = (bufq *)chunk_slurpn(chunk,max_len,reader,reader_ctx,err);
    if ((long)q_local < 0) {
      q_local = (bufq *)0xffffffffffffffff;
    }
    else if (q_local == (bufq *)0x0) {
      *err = CURLE_OK;
    }
  }
  return (ssize_t)q_local;
}

Assistant:

ssize_t Curl_bufq_sipn(struct bufq *q, size_t max_len,
                       Curl_bufq_reader *reader, void *reader_ctx,
                       CURLcode *err)
{
  struct buf_chunk *tail = NULL;
  ssize_t nread;

  *err = CURLE_AGAIN;
  tail = get_non_full_tail(q);
  if(!tail) {
    if(q->chunk_count < q->max_chunks) {
      *err = CURLE_OUT_OF_MEMORY;
      return -1;
    }
    /* full, blocked */
    *err = CURLE_AGAIN;
    return -1;
  }

  nread = chunk_slurpn(tail, max_len, reader, reader_ctx, err);
  if(nread < 0) {
    return -1;
  }
  else if(nread == 0) {
    /* eof */
    *err = CURLE_OK;
  }
  return nread;
}